

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_done(connectdata **connp,CURLcode status,_Bool premature)

{
  connectdata *conn_00;
  SessionHandle *data_00;
  _Bool _Var1;
  int iVar2;
  CURLcode CVar3;
  char *local_58;
  CURLcode res2;
  SessionHandle *data;
  connectdata *conn;
  byte local_1d;
  CURLcode result;
  _Bool premature_local;
  CURLcode status_local;
  connectdata **connp_local;
  
  conn_00 = *connp;
  data_00 = conn_00->data;
  if (((conn_00->bits).done & 1U) == 0) {
    Curl_getoff_all_pipelines(data_00,conn_00);
    if (((conn_00->send_pipe->size + conn_00->recv_pipe->size == 0) ||
        (((data_00->set).reuse_forbid & 1U) != 0)) || (((conn_00->bits).close & 1U) != 0)) {
      (conn_00->bits).done = true;
      if ((data_00->req).newurl != (char *)0x0) {
        (*Curl_cfree)((data_00->req).newurl);
        (data_00->req).newurl = (char *)0x0;
      }
      if ((data_00->req).location != (char *)0x0) {
        (*Curl_cfree)((data_00->req).location);
        (data_00->req).location = (char *)0x0;
      }
      if (conn_00->dns_entry != (Curl_dns_entry *)0x0) {
        Curl_resolv_unlock(data_00,conn_00->dns_entry);
        conn_00->dns_entry = (Curl_dns_entry *)0x0;
      }
      if (((status == CURLE_WRITE_ERROR) || (status == CURLE_READ_ERROR)) ||
         (local_1d = premature, status == CURLE_ABORTED_BY_CALLBACK)) {
        local_1d = 1;
      }
      conn._4_4_ = status;
      if (conn_00->handler->done != (Curl_done_func)0x0) {
        conn._4_4_ = (*conn_00->handler->done)(conn_00,status,(_Bool)(local_1d & 1));
      }
      if ((conn._4_4_ == CURLE_OK) && (iVar2 = Curl_pgrsDone(conn_00), iVar2 != 0)) {
        conn._4_4_ = CURLE_ABORTED_BY_CALLBACK;
      }
      if ((data_00->state).tempwrite != (char *)0x0) {
        (*Curl_cfree)((data_00->state).tempwrite);
        (data_00->state).tempwrite = (char *)0x0;
      }
      if ((((((data_00->set).reuse_forbid & 1U) == 0) || ((conn_00->ntlm).state == NTLMSTATE_TYPE2))
          || ((conn_00->proxyntlm).state == NTLMSTATE_TYPE2)) &&
         ((((conn_00->bits).close & 1U) == 0 && ((local_1d & 1) == 0)))) {
        _Var1 = ConnectionDone(data_00,conn_00);
        if (_Var1) {
          (data_00->state).lastconnect = conn_00;
          if (((conn_00->bits).httpproxy & 1U) == 0) {
            local_58 = (conn_00->host).dispname;
          }
          else {
            local_58 = (conn_00->proxy).dispname;
          }
          Curl_infof(data_00,"Connection #%ld to host %s left intact\n",conn_00->connection_id,
                     local_58);
        }
        else {
          (data_00->state).lastconnect = (connectdata *)0x0;
        }
      }
      else {
        CVar3 = Curl_disconnect(conn_00,(_Bool)(local_1d & 1));
        if ((conn._4_4_ == CURLE_OK) && (CVar3 != CURLE_OK)) {
          conn._4_4_ = CVar3;
        }
      }
      *connp = (connectdata *)0x0;
      Curl_free_request_state(data_00);
      connp_local._4_4_ = conn._4_4_;
    }
    else {
      connp_local._4_4_ = CURLE_OK;
    }
  }
  else {
    connp_local._4_4_ = CURLE_OK;
  }
  return connp_local._4_4_;
}

Assistant:

CURLcode Curl_done(struct connectdata **connp,
                   CURLcode status,  /* an error if this is called after an
                                        error was detected */
                   bool premature)
{
  CURLcode result;
  struct connectdata *conn;
  struct SessionHandle *data;

  DEBUGASSERT(*connp);

  conn = *connp;
  data = conn->data;

  if(conn->bits.done)
    /* Stop if Curl_done() has already been called */
    return CURLE_OK;

  Curl_getoff_all_pipelines(data, conn);

  if((conn->send_pipe->size + conn->recv_pipe->size != 0 &&
      !data->set.reuse_forbid &&
      !conn->bits.close))
    /* Stop if pipeline is not empty and we do not have to close
       connection. */
    return CURLE_OK;

  conn->bits.done = TRUE; /* called just now! */

  /* Cleanup possible redirect junk */
  if(data->req.newurl) {
    free(data->req.newurl);
    data->req.newurl = NULL;
  }
  if(data->req.location) {
    free(data->req.location);
    data->req.location = NULL;
  }

  Curl_resolver_cancel(conn);

  if(conn->dns_entry) {
    Curl_resolv_unlock(data, conn->dns_entry); /* done with this */
    conn->dns_entry = NULL;
  }

  switch(status) {
  case CURLE_ABORTED_BY_CALLBACK:
  case CURLE_READ_ERROR:
  case CURLE_WRITE_ERROR:
    /* When we're aborted due to a callback return code it basically have to
       be counted as premature as there is trouble ahead if we don't. We have
       many callbacks and protocols work differently, we could potentially do
       this more fine-grained in the future. */
    premature = TRUE;
  default:
    break;
  }

  /* this calls the protocol-specific function pointer previously set */
  if(conn->handler->done)
    result = conn->handler->done(conn, status, premature);
  else
    result = status;

  if(!result && Curl_pgrsDone(conn))
    result = CURLE_ABORTED_BY_CALLBACK;

  /* if the transfer was completed in a paused state there can be buffered
     data left to write and then kill */
  if(data->state.tempwrite) {
    free(data->state.tempwrite);
    data->state.tempwrite = NULL;
  }

  /* if data->set.reuse_forbid is TRUE, it means the libcurl client has
     forced us to close this connection. This is ignored for requests taking
     place in a NTLM authentication handshake

     if conn->bits.close is TRUE, it means that the connection should be
     closed in spite of all our efforts to be nice, due to protocol
     restrictions in our or the server's end

     if premature is TRUE, it means this connection was said to be DONE before
     the entire request operation is complete and thus we can't know in what
     state it is for re-using, so we're forced to close it. In a perfect world
     we can add code that keep track of if we really must close it here or not,
     but currently we have no such detail knowledge.
  */

  if((data->set.reuse_forbid && !(conn->ntlm.state == NTLMSTATE_TYPE2 ||
                                  conn->proxyntlm.state == NTLMSTATE_TYPE2))
     || conn->bits.close || premature) {
    CURLcode res2 = Curl_disconnect(conn, premature); /* close connection */

    /* If we had an error already, make sure we return that one. But
       if we got a new error, return that. */
    if(!result && res2)
      result = res2;
  }
  else {
    /* the connection is no longer in use */
    if(ConnectionDone(data, conn)) {
      /* remember the most recently used connection */
      data->state.lastconnect = conn;

      infof(data, "Connection #%ld to host %s left intact\n",
            conn->connection_id,
            conn->bits.httpproxy?conn->proxy.dispname:conn->host.dispname);
    }
    else
      data->state.lastconnect = NULL;
  }

  *connp = NULL; /* to make the caller of this function better detect that
                    this was either closed or handed over to the connection
                    cache here, and therefore cannot be used from this point on
                 */
  Curl_free_request_state(data);

  return result;
}